

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O2

AddressFactory * __thiscall
cfd::AddressFactory::CreateTaprootAddress
          (AddressFactory *this,TaprootScriptTree *tree,SchnorrPubkey *internal_pubkey)

{
  SchnorrPubkey pk;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  cfd::core::TapBranch::GetTweakedPubkey((SchnorrPubkey *)&local_30,(bool *)internal_pubkey);
  CreateTaprootAddress(this,(SchnorrPubkey *)tree);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return this;
}

Assistant:

Address AddressFactory::CreateTaprootAddress(
    const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey) const {
  auto pk = tree.GetTweakedPubkey(internal_pubkey);
  return CreateTaprootAddress(pk);
}